

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O2

void __thiscall
EnvironmentMap::create_images
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,HdrImg *img,
          vector<double,_std::allocator<double>_> *weights_ptr)

{
  shared_ptr<myvk::Image> *this_00;
  shared_ptr<myvk::Image> *this_01;
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkBufferImageCopy> __l_00;
  initializer_list<VkBufferImageCopy> __l_01;
  initializer_list<VkImageMemoryBarrier> __l_02;
  allocator_type local_1a9;
  _Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> local_1a8;
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_188;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_170;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  undefined1 local_148 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  uint32_t uStack_120;
  uint32_t uStack_11c;
  VkImageType VStack_118;
  VkFormat VStack_114;
  shared_ptr<myvk::Buffer> alias_table_image_staging;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::Buffer> hdr_image_staging;
  undefined1 local_c8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type *peStack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  VmaAllocation pVStack_a0;
  void *local_98;
  VkImageMemoryBarrier local_80;
  Ptr<Device> *device;
  
  uVar5 = img->m_height * img->m_width;
  iVar4 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  device = (Ptr<Device> *)CONCAT44(extraout_var,iVar4);
  local_1a8._M_impl.super__Vector_impl_data._M_start._0_4_ = img->m_width;
  local_1a8._M_impl.super__Vector_impl_data._M_start._4_4_ = img->m_height;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)local_148,device,(VkExtent2D *)&local_1a8,1,VK_FORMAT_R32G32B32A32_SFLOAT,6,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  this_00 = &this->m_hdr_image;
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)local_148,
             &this_00->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  myvk::ImageView::Create((ImageView *)local_c8,(Ptr<ImageBase> *)local_148,VK_IMAGE_VIEW_TYPE_2D,1)
  ;
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_hdr_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  local_1a8._M_impl.super__Vector_impl_data._M_start._0_4_ = img->m_width;
  local_1a8._M_impl.super__Vector_impl_data._M_start._4_4_ = img->m_height;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)local_148,device,(VkExtent2D *)&local_1a8,1,VK_FORMAT_R32G32_UINT,6,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  this_01 = &this->m_alias_table_image;
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)local_148,
             &this_01->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  myvk::ImageView::Create((ImageView *)local_c8,(Ptr<ImageBase> *)local_148,VK_IMAGE_VIEW_TYPE_2D,1)
  ;
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_alias_table_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Buffer::CreateStaging<float*>
            ((Buffer *)&hdr_image_staging,device,img->m_data,img->m_data + uVar5 * 4,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Buffer::Create
            ((Buffer *)&alias_table_image_staging,device,(ulong)uVar5 << 3,0x404,1,
             VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  generate_alias_table
            (weights_ptr,
             (AliasPair *)
             (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_mapped_ptr);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_148._0_8_ = (element_type *)0x0;
  local_148._8_8_ = (element_type *)0x0;
  local_148._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_148._24_8_ = (element_type *)0x100000000;
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_120 = 0;
  uVar1 = img->m_width;
  uVar2 = img->m_height;
  VStack_114 = VK_FORMAT_R4G4_UNORM_PACK8;
  uStack_11c = uVar1;
  VStack_118 = uVar2;
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::Fence::Create((Fence *)&fence,device,0);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar3 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::ImageBase::GetDstMemoryBarrier
            ((VkImageMemoryBarrier *)local_c8,
             &((this_00->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImageBase,(VkBufferImageCopy *)local_148,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetDstMemoryBarrier
            (&local_80,
             &((this_01->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImageBase,(VkBufferImageCopy *)local_148,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  __l._M_len = 2;
  __l._M_array = (iterator)local_c8;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_170,__l,
             &local_1a9);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar3,1,0x1000,(vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_1a8
             ,(vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_188,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_170);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_170);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_188);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_1a8);
  peVar3 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_188,
             &hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_170,
             &this_00->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  local_98 = (void *)CONCAT44(VStack_114,VStack_118);
  pVStack_a0 = (VmaAllocation)CONCAT44(uStack_11c,uStack_120);
  local_a8._M_pi = local_128;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_;
  peStack_b0 = (element_type *)local_148._24_8_;
  local_c8._0_8_ = local_148._0_8_;
  local_c8._8_8_ = local_148._8_8_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_c8;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)&local_1a8,__l_00,
             (allocator_type *)&local_1a9);
  myvk::CommandBuffer::CmdCopy
            (peVar3,(Ptr<BufferBase> *)&local_188,(Ptr<ImageBase> *)&local_170,
             (vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)&local_1a8,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
  std::_Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~_Vector_base
            (&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_170._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_188._M_impl.super__Vector_impl_data._M_finish);
  peVar3 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_188,
             &alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_170,
             &this_01->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  local_98 = (void *)CONCAT44(VStack_114,VStack_118);
  pVStack_a0 = (VmaAllocation)CONCAT44(uStack_11c,uStack_120);
  local_a8._M_pi = local_128;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_;
  peStack_b0 = (element_type *)local_148._24_8_;
  local_c8._0_8_ = local_148._0_8_;
  local_c8._8_8_ = local_148._8_8_;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_c8;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)&local_1a8,__l_01,
             (allocator_type *)&local_1a9);
  myvk::CommandBuffer::CmdCopy
            (peVar3,(Ptr<BufferBase> *)&local_188,(Ptr<ImageBase> *)&local_170,
             (vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)&local_1a8,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
  std::_Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~_Vector_base
            (&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_170._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_188._M_impl.super__Vector_impl_data._M_finish);
  peVar3 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::ImageBase::GetDstMemoryBarrier
            ((VkImageMemoryBarrier *)local_c8,
             &((this_00->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImageBase,(VkBufferImageCopy *)local_148,0x1000,0,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
             0xffffffff,0xffffffff);
  myvk::ImageBase::GetDstMemoryBarrier
            (&local_80,
             &((this_01->super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImageBase,(VkBufferImageCopy *)local_148,0x1000,0,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
             0xffffffff,0xffffffff);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_c8;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_170,
             __l_02,&local_1a9);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar3,0x1000,0x2000,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_1a8,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_188,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_170);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_170);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_188);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_1a8);
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void EnvironmentMap::create_images(const std::shared_ptr<myvk::CommandPool> &command_pool, const HdrImg &img,
                                   std::vector<double> *weights_ptr) {
	const uint32_t img_size = img.m_width * img.m_height;
	const VkDeviceSize img_bytes = img_size * sizeof(float) * 4;

	const std::shared_ptr<myvk::Device> &device = command_pool->GetDevicePtr();

	// create vulkan objects
	m_hdr_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	                                           VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_hdr_image_view = myvk::ImageView::Create(m_hdr_image, VK_IMAGE_VIEW_TYPE_2D);
	m_alias_table_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32_UINT,
	                                                   VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_alias_table_image_view = myvk::ImageView::Create(m_alias_table_image, VK_IMAGE_VIEW_TYPE_2D);

	// create and fill staging objects
	std::shared_ptr<myvk::Buffer> hdr_image_staging =
	    myvk::Buffer::CreateStaging(device, img.m_data, img.m_data + img_size * 4);

	std::shared_ptr<myvk::Buffer> alias_table_image_staging = myvk::Buffer::CreateStaging<AliasPair>(
	    device, img_size, [weights_ptr](AliasPair *data) { generate_alias_table(weights_ptr, data); });

	// copy data
	VkBufferImageCopy region = {};
	region.bufferOffset = 0;
	region.bufferRowLength = 0;
	region.bufferImageHeight = 0;
	region.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
	region.imageSubresource.mipLevel = 0;
	region.imageSubresource.baseArrayLayer = 0;
	region.imageSubresource.layerCount = 1;
	region.imageOffset = {0, 0, 0};
	region.imageExtent = {img.m_width, img.m_height, 1};

	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_hdr_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_alias_table_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                              VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});
	command_buffer->CmdCopy(hdr_image_staging, m_hdr_image, {region});
	command_buffer->CmdCopy(alias_table_image_staging, m_alias_table_image, {region});
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {
	        m_hdr_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                         VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                         VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	        m_alias_table_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                                 VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	    });
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}